

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

uint UFPC::MemMerge(uint i,uint j)

{
  pointer puVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  int *piVar8;
  uint *puVar9;
  uint *puVar10;
  int *piVar11;
  int iVar12;
  
  piVar2 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)i;
  iVar3 = *piVar6;
  *piVar6 = iVar3 + 1;
  puVar7 = puVar1 + (int)i;
  piVar8 = piVar6;
  puVar9 = puVar7;
  uVar5 = i;
  if (*puVar7 < i) {
    do {
      *piVar8 = iVar3 + 2;
      uVar5 = *puVar9;
      piVar8 = piVar2 + (int)uVar5;
      iVar3 = *piVar8;
      *piVar8 = iVar3 + 1;
      puVar9 = puVar1 + (int)uVar5;
    } while (puVar1[(int)uVar5] < uVar5);
  }
  if (i != j) {
    piVar8 = piVar2 + (int)j;
    iVar12 = *piVar8;
    iVar3 = iVar12 + 1;
    *piVar8 = iVar3;
    puVar9 = puVar1 + (int)j;
    puVar10 = puVar9;
    piVar11 = piVar8;
    uVar4 = j;
    if (*puVar9 < j) {
      do {
        *piVar11 = iVar12 + 2;
        uVar4 = *puVar10;
        piVar11 = piVar2 + (int)uVar4;
        iVar12 = *piVar11;
        *piVar11 = iVar12 + 1;
        puVar10 = puVar1 + (int)uVar4;
      } while (puVar1[(int)uVar4] < uVar4);
      iVar3 = *piVar8;
    }
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    uVar5 = uVar4;
    *piVar8 = iVar3 + 1;
    if (*puVar9 < j) {
      do {
        *piVar8 = iVar3 + 2;
        uVar4 = *puVar9;
        *piVar8 = iVar3 + 3;
        *puVar9 = uVar5;
        piVar8 = piVar2 + (int)uVar4;
        iVar3 = *piVar8;
        *piVar8 = iVar3 + 1;
        puVar9 = puVar1 + (int)uVar4;
      } while (*puVar9 < uVar4);
    }
    *piVar8 = iVar3 + 2;
    *puVar9 = uVar5;
  }
  iVar3 = *piVar6;
  *piVar6 = iVar3 + 1;
  if (*puVar7 < i) {
    do {
      *piVar6 = iVar3 + 2;
      uVar4 = *puVar7;
      *piVar6 = iVar3 + 3;
      *puVar7 = uVar5;
      piVar6 = piVar2 + (int)uVar4;
      iVar3 = *piVar6;
      *piVar6 = iVar3 + 1;
      puVar7 = puVar1 + (int)uVar4;
    } while (*puVar7 < uVar4);
  }
  *piVar6 = iVar3 + 2;
  *puVar7 = uVar5;
  return uVar5;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (mem_P_[root] < root) {
            root = mem_P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (mem_P_[root_j] < root_j) {
                root_j = mem_P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (mem_P_[j] < j) {
                unsigned t = mem_P_[j];
                mem_P_[j] = root;
                j = t;
            }
            mem_P_[j] = root;
        }
        // SetRoot(i, root);
        while (mem_P_[i] < i) {
            unsigned t = mem_P_[i];
            mem_P_[i] = root;
            i = t;
        }
        mem_P_[i] = root;
        return root;
    }